

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
gulps::message::message
          (message *this,level lvl,char *major,char *minor,char *path,int64_t line,string *text,
          color clr)

{
  int64_t iVar1;
  char *pcVar2;
  time_t tVar3;
  gulps *this_00;
  string *psVar4;
  allocator local_4e;
  allocator local_4d [20];
  allocator local_39;
  int64_t local_38;
  int64_t line_local;
  char *path_local;
  char *minor_local;
  char *major_local;
  message *pmStack_10;
  level lvl_local;
  message *this_local;
  
  local_38 = line;
  line_local = (int64_t)path;
  path_local = minor;
  minor_local = major;
  major_local._4_4_ = lvl;
  pmStack_10 = this;
  tVar3 = time((time_t *)0x0);
  pcVar2 = minor_local;
  this->time = tVar3;
  this->lvl = major_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->cat_major,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar2 = path_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->cat_minor,pcVar2,local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  iVar1 = line_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->src_path,(char *)iVar1,&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  this->src_line = local_38;
  this_00 = inst();
  psVar4 = get_thread_tag_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&this->thread_id,(string *)psVar4);
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  this->clr = clr;
  return;
}

Assistant:

message(level lvl, const char* major, const char* minor, const char* path, int64_t line, std::string&& text, fmt::color clr = fmt::color::white) : 
			time(std::time(nullptr)), lvl(lvl), cat_major(major), cat_minor(minor), src_path(path), src_line(line),
			thread_id(gulps::inst().get_thread_tag()), text(std::move(text)), clr(clr)
		{
		}